

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchTest.cpp
# Opt level: O0

void __thiscall
oout::MatchTest::MatchTest
          (MatchTest *this,shared_ptr<const_oout::Text> *text,shared_ptr<const_oout::Match> *match)

{
  shared_ptr<const_oout::Match> *match_local;
  shared_ptr<const_oout::Text> *text_local;
  MatchTest *this_local;
  
  Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MatchTest_00168590;
  std::shared_ptr<const_oout::Text>::shared_ptr(&this->text,text);
  std::shared_ptr<const_oout::Match>::shared_ptr(&this->match,match);
  return;
}

Assistant:

MatchTest::MatchTest(
	const shared_ptr<const Text> &text,
	const shared_ptr<const Match> &match
) : text(text), match(match)
{
}